

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void shift_and_clamp_sse4_1(__m128i *in0,__m128i *in1,__m128i *clamp_lo,__m128i *clamp_hi,int shift)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  byte local_18c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i in1_w_offset;
  __m128i in0_w_offset;
  __m128i offset;
  int shift_local;
  __m128i *clamp_hi_local;
  __m128i *clamp_lo_local;
  __m128i *in1_local;
  __m128i *in0_local;
  
  local_18c = (byte)shift;
  iVar2 = (1 << (local_18c & 0x1f)) >> 1;
  local_138 = (int)(*in0)[0];
  iStack_134 = (int)((ulong)(*in0)[0] >> 0x20);
  iStack_130 = (int)(*in0)[1];
  iStack_12c = (int)((ulong)(*in0)[1] >> 0x20);
  local_158 = (int)(*in1)[0];
  iStack_154 = (int)((ulong)(*in1)[0] >> 0x20);
  iStack_150 = (int)(*in1)[1];
  iStack_14c = (int)((ulong)(*in1)[1] >> 0x20);
  auVar1 = ZEXT416((uint)shift);
  iVar3 = local_138 + iVar2 >> auVar1;
  iVar7 = iStack_134 + iVar2 >> auVar1;
  iVar11 = iStack_130 + iVar2 >> auVar1;
  iVar15 = iStack_12c + iVar2 >> auVar1;
  auVar1 = ZEXT416((uint)shift);
  iVar4 = local_158 + iVar2 >> auVar1;
  iVar8 = iStack_154 + iVar2 >> auVar1;
  iVar12 = iStack_150 + iVar2 >> auVar1;
  iVar2 = iStack_14c + iVar2 >> auVar1;
  local_d8 = (int)(*clamp_lo)[0];
  iStack_d4 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
  iStack_d0 = (int)(*clamp_lo)[1];
  iStack_cc = (int)((ulong)(*clamp_lo)[1] >> 0x20);
  uVar5 = (uint)(iVar3 < local_d8) * local_d8 | (uint)(iVar3 >= local_d8) * iVar3;
  uVar9 = (uint)(iVar7 < iStack_d4) * iStack_d4 | (uint)(iVar7 >= iStack_d4) * iVar7;
  uVar13 = (uint)(iVar11 < iStack_d0) * iStack_d0 | (uint)(iVar11 >= iStack_d0) * iVar11;
  uVar16 = (uint)(iVar15 < iStack_cc) * iStack_cc | (uint)(iVar15 >= iStack_cc) * iVar15;
  local_98 = (int)(*clamp_hi)[0];
  iStack_94 = (int)((ulong)(*clamp_hi)[0] >> 0x20);
  iStack_90 = (int)(*clamp_hi)[1];
  iStack_8c = (int)((ulong)(*clamp_hi)[1] >> 0x20);
  local_f8 = (int)(*clamp_lo)[0];
  iStack_f4 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
  iStack_f0 = (int)(*clamp_lo)[1];
  iStack_ec = (int)((ulong)(*clamp_lo)[1] >> 0x20);
  uVar6 = (uint)(iVar4 < local_f8) * local_f8 | (uint)(iVar4 >= local_f8) * iVar4;
  uVar10 = (uint)(iVar8 < iStack_f4) * iStack_f4 | (uint)(iVar8 >= iStack_f4) * iVar8;
  uVar14 = (uint)(iVar12 < iStack_f0) * iStack_f0 | (uint)(iVar12 >= iStack_f0) * iVar12;
  uVar17 = (uint)(iVar2 < iStack_ec) * iStack_ec | (uint)(iVar2 >= iStack_ec) * iVar2;
  local_b8 = (int)(*clamp_hi)[0];
  iStack_b4 = (int)((ulong)(*clamp_hi)[0] >> 0x20);
  iStack_b0 = (int)(*clamp_hi)[1];
  iStack_ac = (int)((ulong)(*clamp_hi)[1] >> 0x20);
  (*in0)[0] = CONCAT44((uint)(iStack_94 < (int)uVar9) * iStack_94 |
                       (iStack_94 >= (int)uVar9) * uVar9,
                       (uint)(local_98 < (int)uVar5) * local_98 | (local_98 >= (int)uVar5) * uVar5);
  (*in0)[1] = CONCAT44((uint)(iStack_8c < (int)uVar16) * iStack_8c |
                       (iStack_8c >= (int)uVar16) * uVar16,
                       (uint)(iStack_90 < (int)uVar13) * iStack_90 |
                       (iStack_90 >= (int)uVar13) * uVar13);
  (*in1)[0] = CONCAT44((uint)(iStack_b4 < (int)uVar10) * iStack_b4 |
                       (iStack_b4 >= (int)uVar10) * uVar10,
                       (uint)(local_b8 < (int)uVar6) * local_b8 | (local_b8 >= (int)uVar6) * uVar6);
  (*in1)[1] = CONCAT44((uint)(iStack_ac < (int)uVar17) * iStack_ac |
                       (iStack_ac >= (int)uVar17) * uVar17,
                       (uint)(iStack_b0 < (int)uVar14) * iStack_b0 |
                       (iStack_b0 >= (int)uVar14) * uVar14);
  return;
}

Assistant:

static void shift_and_clamp_sse4_1(__m128i *in0, __m128i *in1,
                                   const __m128i *clamp_lo,
                                   const __m128i *clamp_hi, int shift) {
  __m128i offset = _mm_set1_epi32((1 << shift) >> 1);
  __m128i in0_w_offset = _mm_add_epi32(*in0, offset);
  __m128i in1_w_offset = _mm_add_epi32(*in1, offset);

  in0_w_offset = _mm_sra_epi32(in0_w_offset, _mm_cvtsi32_si128(shift));
  in1_w_offset = _mm_sra_epi32(in1_w_offset, _mm_cvtsi32_si128(shift));

  in0_w_offset = _mm_max_epi32(in0_w_offset, *clamp_lo);
  in0_w_offset = _mm_min_epi32(in0_w_offset, *clamp_hi);
  in1_w_offset = _mm_max_epi32(in1_w_offset, *clamp_lo);
  in1_w_offset = _mm_min_epi32(in1_w_offset, *clamp_hi);

  *in0 = in0_w_offset;
  *in1 = in1_w_offset;
}